

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode-t16.inc.c
# Opt level: O0

void disas_t16_extract_ldst_rr(DisasContext_conflict1 *ctx,arg_ldst_rr *a,uint16_t insn)

{
  uint32_t uVar1;
  uint16_t insn_local;
  arg_ldst_rr *a_local;
  DisasContext_conflict1 *ctx_local;
  
  uVar1 = extract32((uint)insn,6,3);
  a->rm = uVar1;
  uVar1 = extract32((uint)insn,3,3);
  a->rn = uVar1;
  uVar1 = extract32((uint)insn,0,3);
  a->rt = uVar1;
  a->p = 1;
  a->w = 0;
  a->u = 1;
  a->shimm = 0;
  a->shtype = 0;
  return;
}

Assistant:

static void disas_t16_extract_ldst_rr(DisasContext *ctx, arg_ldst_rr *a, uint16_t insn)
{
    a->rm = extract32(insn, 6, 3);
    a->rn = extract32(insn, 3, 3);
    a->rt = extract32(insn, 0, 3);
    a->p = 1;
    a->w = 0;
    a->u = 1;
    a->shimm = 0;
    a->shtype = 0;
}